

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_gccattribute(CPState *cp,CPDecl *decl)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  CPState *cp_00;
  long in_RSI;
  long in_RDI;
  CTSize vsize;
  char *c;
  GCstr *attrstr;
  char *in_stack_00000038;
  lua_State *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  CPState *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  CTSize in_stack_ffffffffffffffdc;
  
  cp_next((CPState *)0x17c6b8);
  cp_check(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  cp_check(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  do {
    if (*(int *)(in_RDI + 4) == 0x29) break;
    if (*(int *)(in_RDI + 4) == 0x100) {
      lVar1 = *(long *)(in_RDI + 0x10);
      lVar2 = *(long *)(in_RDI + 0x10);
      cp_00 = (CPState *)(lVar2 + 0x10);
      if ((((0xc < *(uint *)(lVar1 + 0xc)) && ((char)cp_00->c == '_')) &&
          (*(char *)(lVar2 + 0x11) == '_')) &&
         (((*(char *)(lVar2 + 0x12) != '_' &&
           (cp_00->packstack[(ulong)(*(int *)(lVar1 + 0xc) - 2) - 0x68] == '_')) &&
          (cp_00->packstack[(ulong)(*(int *)(lVar1 + 0xc) - 1) - 0x68] == '_')))) {
        lj_str_new(in_stack_00000040,in_stack_00000038,(size_t)cp);
      }
      cp_next((CPState *)0x17c7ba);
      uVar3 = lj_cparse_case((GCstr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (char *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 = (CPState *)(ulong)uVar3;
      switch(in_stack_ffffffffffffffd0) {
      case (CPState *)0x0:
      case (CPState *)0x1:
        cp_decl_align(in_stack_ffffffffffffffd0,
                      (CPDecl *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        break;
      case (CPState *)0x2:
      case (CPState *)0x3:
        *(uint *)(in_RSI + 0x2c) = *(uint *)(in_RSI + 0x2c) | 2;
        break;
      case (CPState *)0x4:
      case (CPState *)0x5:
        cp_decl_mode(cp_00,(CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        break;
      case (CPState *)0x6:
      case (CPState *)0x7:
        in_stack_ffffffffffffffdc = cp_decl_sizeattr(in_stack_ffffffffffffffd0);
        if (in_stack_ffffffffffffffdc != 0) {
          uVar3 = 0x1f;
          if (in_stack_ffffffffffffffdc != 0) {
            for (; in_stack_ffffffffffffffdc >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          *(uint *)(in_RSI + 0x2c) = *(uint *)(in_RSI + 0x2c) & 0xffffff0f | (uVar3 & 0xf) << 4;
        }
        break;
      default:
        goto switchD_0017c7ee_default;
      }
    }
    else {
      if (*(int *)(in_RDI + 4) < 0x10d) break;
      cp_next((CPState *)0x17c880);
switchD_0017c7ee_default:
      iVar4 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
      if (iVar4 != 0) {
        while( true ) {
          uVar3 = in_stack_ffffffffffffffcc & 0xffffff;
          if (*(int *)(in_RDI + 4) != 0x29) {
            uVar3 = CONCAT13(*(int *)(in_RDI + 4) != 0x103,(int3)in_stack_ffffffffffffffcc);
          }
          in_stack_ffffffffffffffcc = uVar3;
          if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\0') break;
          cp_next((CPState *)0x17c8ce);
        }
        cp_check(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      }
    }
    iVar4 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  } while (iVar4 != 0);
  cp_check(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  cp_check(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static void cp_decl_gccattribute(CPState *cp, CPDecl *decl)
{
  cp_next(cp);
  cp_check(cp, '(');
  cp_check(cp, '(');
  while (cp->tok != ')') {
    if (cp->tok == CTOK_IDENT) {
      GCstr *attrstr = cp->str;
#if LUAJIT_SMART_STRINGS
      /*
       * Sadly, several option __name__-s exceed 12 bytes hence they
       * could've been interned using the full hash.  Strip "__" to stay
       * within limits.
       */
      const char *c = strdata(cp->str);
      if (attrstr->len > 12 && c[0]=='_' && c[1]=='_' && c[2] != '_' &&
	  c[attrstr->len-2]=='_' && c[attrstr->len-1]=='_')
	attrstr = lj_str_new(cp->L, c+2, attrstr->len-4);
#endif
      cp_next(cp);
      switch (lj_cparse_case(attrstr,
		"\007aligned" "\013__aligned__"
		"\006packed" "\012__packed__"
		"\004mode" "\010__mode__"
		"\013vector_size" "\017__vector_size__"
#if LJ_TARGET_X86
		"\007regparm" "\013__regparm__"
		"\005cdecl"  "\011__cdecl__"
		"\010thiscall" "\014__thiscall__"
		"\010fastcall" "\014__fastcall__"
		"\007stdcall" "\013__stdcall__"
		"\012sseregparm" "\016__sseregparm__"
#endif
	      )) {
      case 0: case 1: /* aligned */
	cp_decl_align(cp, decl);
	break;
      case 2: case 3: /* packed */
	decl->attr |= CTFP_PACKED;
	break;
      case 4: case 5: /* mode */
	cp_decl_mode(cp, decl);
	break;
      case 6: case 7: /* vector_size */
	{
	  CTSize vsize = cp_decl_sizeattr(cp);
	  if (vsize) CTF_INSERT(decl->attr, VSIZEP, lj_fls(vsize));
	}
	break;
#if LJ_TARGET_X86
      case 8: case 9: /* regparm */
	CTF_INSERT(decl->fattr, REGPARM, cp_decl_sizeattr(cp));
	decl->fattr |= CTFP_CCONV;
	break;
      case 10: case 11: /* cdecl */
	CTF_INSERT(decl->fattr, CCONV, CTCC_CDECL);
	decl->fattr |= CTFP_CCONV;
	break;
      case 12: case 13: /* thiscall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_THISCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case 14: case 15: /* fastcall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_FASTCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case 16: case 17: /* stdcall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_STDCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case 18: case 19: /* sseregparm */
	decl->fattr |= CTF_SSEREGPARM;
	decl->fattr |= CTFP_CCONV;
	break;
#endif
      default:  /* Skip all other attributes. */
	goto skip_attr;
      }
    } else if (cp->tok >= CTOK_FIRSTDECL) {  /* For __attribute((const)) etc. */
      cp_next(cp);
    skip_attr:
      if (cp_opt(cp, '(')) {
	while (cp->tok != ')' && cp->tok != CTOK_EOF) cp_next(cp);
	cp_check(cp, ')');
      }
    } else {
      break;
    }
    if (!cp_opt(cp, ',')) break;
  }
  cp_check(cp, ')');
  cp_check(cp, ')');
}